

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joinside.cpp
# Opt level: O3

JoinSide duckdb::JoinSide::GetJoinSide
                   (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                    *bindings,
                   unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                   *left_bindings,
                   unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                   *right_bindings)

{
  JoinValue JVar1;
  const_iterator cVar2;
  JoinValue JVar3;
  JoinValue JVar4;
  _Hash_node_base *p_Var5;
  bool bVar6;
  _Hash_node_base *local_28;
  
  p_Var5 = (bindings->_M_h)._M_before_begin._M_nxt;
  if (p_Var5 == (_Hash_node_base *)0x0) {
    JVar4 = NONE;
  }
  else {
    JVar4 = NONE;
    do {
      local_28 = p_Var5[1]._M_nxt;
      cVar2 = ::std::
              _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::find(&left_bindings->_M_h,(key_type *)&local_28);
      JVar1 = (cVar2.super__Node_iterator_base<unsigned_long,_false>._M_cur == (__node_type *)0x0) +
              LEFT;
      JVar3 = JVar4;
      if (JVar4 != JVar1) {
        JVar3 = BOTH;
      }
      bVar6 = JVar4 != NONE;
      JVar4 = JVar1;
      if (bVar6) {
        JVar4 = JVar3;
      }
      p_Var5 = p_Var5->_M_nxt;
    } while (p_Var5 != (_Hash_node_base *)0x0);
  }
  return (JoinSide)JVar4;
}

Assistant:

JoinSide JoinSide::GetJoinSide(const unordered_set<idx_t> &bindings, const unordered_set<idx_t> &left_bindings,
                               const unordered_set<idx_t> &right_bindings) {
	JoinSide side = JoinSide::NONE;
	for (auto binding : bindings) {
		side = CombineJoinSide(side, GetJoinSide(binding, left_bindings, right_bindings));
	}
	return side;
}